

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepvalue(rnndb *db,rnnvalue *val,char *prefix,rnnvarinfo *parvi)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  rnnvarinfo *in_stack_00000038;
  rnnvarinfo *in_stack_00000040;
  char *in_stack_00000048;
  rnndb *in_stack_00000050;
  
  pcVar1 = catstr(in_RDX,in_RCX);
  *(char **)(in_RSI + 0x58) = pcVar1;
  prepvarinfo(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if ((*(int *)(in_RSI + 0x30) == 0) && (*(long *)(in_RSI + 0x40) != 0)) {
    pcVar1 = catstr(in_RDX,in_RCX);
    *(char **)(in_RSI + 0x58) = pcVar1;
  }
  return;
}

Assistant:

static void prepvalue(struct rnndb *db, struct rnnvalue *val, char *prefix, struct rnnvarinfo *parvi) {
	val->fullname = catstr(prefix, val->name);
	prepvarinfo (db, val->fullname, &val->varinfo, parvi);
	if (val->varinfo.dead)
		return;
	if (val->varinfo.prefix)
		val->fullname = catstr(val->varinfo.prefix, val->fullname);
}